

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O0

IPAsKey * __thiscall
BinHash<IPAsKey>::DoInsert(BinHash<IPAsKey> *this,IPAsKey *key,bool need_alloc,bool *stored)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  undefined4 extraout_var;
  uint uVar4;
  byte local_49;
  IPAsKey *local_40;
  IPAsKey *oldKey;
  IPAsKey *pIStack_30;
  uint32_t hash_index;
  IPAsKey *retKey;
  bool *stored_local;
  bool need_alloc_local;
  IPAsKey *key_local;
  BinHash<IPAsKey> *this_local;
  
  pIStack_30 = (IPAsKey *)0x0;
  *stored = false;
  if ((key != (IPAsKey *)0x0) && (this->tableSize != 0)) {
    uVar2 = IPAsKey::Hash(key);
    uVar4 = uVar2 % this->tableSize;
    local_40 = this->hashBin[uVar4];
    while( true ) {
      local_49 = 0;
      if (local_40 != (IPAsKey *)0x0) {
        bVar1 = IPAsKey::IsSameKey(key,local_40);
        local_49 = bVar1 ^ 0xff;
      }
      if ((local_49 & 1) == 0) break;
      local_40 = local_40->HashNext;
    }
    if (local_40 == (IPAsKey *)0x0) {
      pIStack_30 = key;
      if (need_alloc) {
        iVar3 = (*key->_vptr_IPAsKey[2])();
        pIStack_30 = (IPAsKey *)CONCAT44(extraout_var,iVar3);
      }
      if (pIStack_30 != (IPAsKey *)0x0) {
        pIStack_30->HashNext = this->hashBin[uVar4];
        this->hashBin[uVar4] = pIStack_30;
        *stored = true;
        this->tableCount = this->tableCount + 1;
      }
    }
    else {
      (*local_40->_vptr_IPAsKey[3])(local_40,key);
      pIStack_30 = local_40;
      *stored = false;
    }
  }
  return pIStack_30;
}

Assistant:

KeyObj * DoInsert(KeyObj * key, bool need_alloc, bool * stored)
    {
        KeyObj * retKey = NULL;

        *stored = false;

        if (key != NULL && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;
            KeyObj * oldKey = hashBin[hash_index];

            while (oldKey != NULL && !key->IsSameKey(oldKey))
            {
                oldKey = oldKey->HashNext;
            }

            if (oldKey != NULL)
            {
                /* the keyed object is already in the table*/
                oldKey->Add(key);
                retKey = oldKey;
                *stored = false;
            }
            else
            {
                retKey = key;

                if (need_alloc)
                {
                    retKey = key->CreateCopy();
                }

                if (retKey != NULL)
                {
                    retKey->HashNext = hashBin[hash_index];
                    hashBin[hash_index] = retKey;
                    *stored = true;
                    tableCount++;
                }
            }
        }

        return retKey;
    }